

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O3

bool Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::RescanObject
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block,
               char *objectAddress,uint localObjectSize,uint objectIndex,Recycler *recycler)

{
  size_t *psVar1;
  byte bVar2;
  code *pcVar3;
  size_t sVar4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  byte *pbVar8;
  undefined4 *puVar9;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM1_Qb_01;
  undefined8 local_38;
  
  local_38 = (ulong)localObjectSize;
  pbVar8 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                     ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)block,objectIndex);
  bVar2 = *pbVar8;
  uVar7 = (uint)(block->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.heapBlockType
  ;
  if ((10 < uVar7) || ((0x528U >> (uVar7 & 0x1f) & 1) == 0)) {
    local_38 = CONCAT44(objectIndex,localObjectSize);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_01;
    in_XMM1._0_8_ = extraout_XMM1_Qa_01;
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x166,"(block->IsAnyFinalizableBlock())","block->IsAnyFinalizableBlock()");
    if (!bVar5) goto LAB_007311d2;
    *puVar9 = 0;
  }
  if ((bVar2 & 0x20) == 0) {
    uVar6 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAddressIndex
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)block,objectAddress);
    if (uVar6 == 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x16a,
                         "(block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)"
                         ,
                         "block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit"
                        );
      if (!bVar5) goto LAB_007311d2;
      *puVar9 = 0;
    }
    if ((recycler->collectionState).value == CollectionStateParallelMark) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                         "this->collectionState != CollectionStateParallelMark");
      if (!bVar5) {
LAB_007311d2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    bVar5 = MarkContext::AddMarkedObject(&recycler->markContext,objectAddress,local_38 & 0xffffffff)
    ;
    if (bVar5) {
      sVar4 = (recycler->collectionStats).markData.rescanObjectByteCount;
      auVar10 = pmovsxbq(in_XMM1,0x101);
      (recycler->collectionStats).markData.rescanObjectCount =
           auVar10._0_8_ + (recycler->collectionStats).markData.rescanObjectCount;
      (recycler->collectionStats).markData.rescanObjectByteCount = (local_38 & 0xffffffff) + sVar4;
      goto LAB_00731123;
    }
LAB_00731140:
    bVar5 = false;
  }
  else {
LAB_00731123:
    if ((~bVar2 & 0x14) == 0) {
      bVar5 = RescanTrackedObject(block,(FinalizableObject *)objectAddress,objectIndex,recycler);
      if (!bVar5) goto LAB_00731140;
    }
    else if ((char)bVar2 < '\0') {
      if ((bVar2 & 4) != 0) {
        psVar1 = &(recycler->collectionStats).finalizeCount;
        *psVar1 = *psVar1 + 1;
      }
      pbVar8 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ObjectInfo
                         ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)block,objectIndex);
      *pbVar8 = *pbVar8 & 0xfb;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool
SmallFinalizableHeapBlockT<TBlockAttributes>::RescanObject(SmallFinalizableHeapBlockT<TBlockAttributes> * block, __in_ecount(localObjectSize) char * objectAddress, uint localObjectSize,
    uint objectIndex, Recycler * recycler)
{
    unsigned char const attributes = block->ObjectInfo(objectIndex);
    Assert(block->IsAnyFinalizableBlock());

    if ((attributes & LeafBit) == 0)
    {
        Assert(block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

        if (!recycler->AddMark(objectAddress, localObjectSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_INC(recycler, markData.rescanObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize);
    }

    // Since we mark through unallocated objects, we might have marked an object before it
    // is allocated as a tracked object. The object will not be queue up in the
    // tracked object list, and NewTrackBit will still be on. Queue it up now.

    // NewTrackBit will also be on for tracked object that we weren't able to queue
    // because of OOM.  In those case, the page is forced to be rescan, and we will
    // try to process those again here.
    if ((attributes & (TrackBit | NewTrackBit)) == (TrackBit | NewTrackBit))
    {
        if (!block->RescanTrackedObject((FinalizableObject*) objectAddress, objectIndex, recycler))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }
    }
#ifdef RECYCLER_STATS
    else if (attributes & FinalizeBit)
    {
        // Concurrent thread mark the object before the attribute is set and missed the finalize count
        // For finalized object, we will always write a dummy vtable before returning to the call,
        // so the page will always need to be rescanned, and we can count those here.

        // NewFinalizeBit is cleared if the background thread has already counted the object.
        // So if it is still set here, we need to count it

        RECYCLER_STATS_INC_IF(attributes & NewFinalizeBit, recycler, finalizeCount);
        block->ObjectInfo(objectIndex) &= ~NewFinalizeBit;
    }
#endif

    return true;
}